

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O1

void __thiscall module_level_html_actions::level_start(module_level_html_actions *this,int level)

{
  long lVar1;
  char *pcVar2;
  ostream *poVar3;
  
  if (level < 0x3fffffff) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  <h2 id=\'level:",0x10);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,level);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'>Level ",8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,level);
    pcVar2 = "</h2>\n";
    lVar1 = 6;
  }
  else {
    poVar3 = (ostream *)&std::cout;
    pcVar2 = "  <h2>Level <em>undetermined</em></h2>\n";
    lVar1 = 0x27;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,lVar1);
  this->level_ = level;
  return;
}

Assistant:

void level_start( int level )
    {
        if( level >= unknown_level )
        {
            std::cout << "  <h2>Level <em>undetermined</em></h2>\n";
        }
        else
        {
            std::cout << "  <h2 id='level:" << level << "'>Level " << level << "</h2>\n";
        }

        level_ = level;
    }